

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

IntBoundedValueInfo * __thiscall
GlobOpt::NewIntBoundedValueInfo(GlobOpt *this,ValueInfo *originalValueInfo,IntBounds *bounds)

{
  ValueType type;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar5;
  IntBoundedValueInfo *this_00;
  Sym *sym;
  bool local_39;
  IntBoundedValueInfo *valueInfo;
  IntBounds *bounds_local;
  ValueInfo *originalValueInfo_local;
  GlobOpt *this_local;
  
  if (originalValueInfo == (ValueInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1136,"(originalValueInfo)","originalValueInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  IntBounds::Verify(bounds);
  paVar5 = &ValueInfo::Type(originalValueInfo)->field_0;
  type.field_0 = (anon_union_2_4_ea848c7b_for_ValueType_13)
                 *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&paVar5->field_0;
  iVar3 = IntBounds::ConstantLowerBound(bounds);
  local_39 = false;
  if (iVar3 < 1) {
    iVar3 = IntBounds::ConstantUpperBound(bounds);
    local_39 = false;
    if (-1 < iVar3) {
      local_39 = ValueInfo::WasNegativeZeroPreventedByBailout(originalValueInfo);
    }
  }
  this_00 = IntBoundedValueInfo::New(type,bounds,local_39,this->alloc);
  sym = ValueInfo::GetSymStore(originalValueInfo);
  ValueInfo::SetSymStore(&this_00->super_ValueInfo,sym);
  return this_00;
}

Assistant:

IntBoundedValueInfo *GlobOpt::NewIntBoundedValueInfo(
    const ValueInfo *const originalValueInfo,
    const IntBounds *const bounds) const
{
    Assert(originalValueInfo);
    bounds->Verify();

    IntBoundedValueInfo *const valueInfo =
        IntBoundedValueInfo::New(
            originalValueInfo->Type(),
            bounds,
            (
                bounds->ConstantLowerBound() <= 0 &&
                bounds->ConstantUpperBound() >= 0 &&
                originalValueInfo->WasNegativeZeroPreventedByBailout()
            ),
            alloc);
    valueInfo->SetSymStore(originalValueInfo->GetSymStore());
    return valueInfo;
}